

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O1

uint __thiscall
xercesc_4_0::WFElemStack::mapPrefixToURI(WFElemStack *this,XMLCh *prefixToMap,bool *unknown)

{
  uint uVar1;
  RefHashTableOf<xercesc_4_0::XMLStringPool::PoolElem,_xercesc_4_0::StringHasher> *pRVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  PoolElem *pPVar7;
  int iVar8;
  XMLCh *pXVar9;
  XMLCh XVar10;
  RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *pRVar11;
  
  *unknown = false;
  pRVar2 = (this->fPrefixPool).fHashTable;
  if ((prefixToMap == (XMLCh *)0x0) || (uVar5 = (ulong)(ushort)*prefixToMap, uVar5 == 0)) {
    uVar5 = 0;
  }
  else {
    XVar10 = prefixToMap[1];
    if (XVar10 != L'\0') {
      pXVar9 = prefixToMap + 2;
      do {
        uVar5 = (ulong)(ushort)XVar10 + (uVar5 >> 0x18) + uVar5 * 0x26;
        XVar10 = *pXVar9;
        pXVar9 = pXVar9 + 1;
      } while (XVar10 != L'\0');
    }
    uVar5 = uVar5 % pRVar2->fHashModulus;
  }
  pRVar11 = pRVar2->fBucketList[uVar5];
  if (pRVar11 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    do {
      bVar3 = StringHasher::equals((StringHasher *)&pRVar2->field_0x30,prefixToMap,pRVar11->fKey);
      if (bVar3) goto LAB_002a561d;
      pRVar11 = pRVar11->fNext;
    } while (pRVar11 != (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0);
  }
  pRVar11 = (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0;
LAB_002a561d:
  uVar4 = 0;
  if (pRVar11 == (RefHashTableBucketElem<xercesc_4_0::XMLStringPool::PoolElem> *)0x0) {
    pPVar7 = (PoolElem *)0x0;
  }
  else {
    pPVar7 = pRVar11->fData;
  }
  if (pPVar7 != (PoolElem *)0x0) {
    uVar4 = pPVar7->fId;
  }
  if (uVar4 != 0) {
    if (uVar4 == this->fXMLPoolId) {
      return this->fXMLNamespaceId;
    }
    if (uVar4 == this->fXMLNSPoolId) {
      return this->fXMLNSNamespaceId;
    }
    uVar1 = this->fStack[this->fStackTop - 1]->fTopPrefix;
    uVar5 = (ulong)(int)uVar1;
    uVar6 = uVar1 >> 0x1f;
    bVar3 = SUB41(uVar1 >> 0x1f,0);
    if (-1 < (long)uVar5) {
      while (bVar3 = SUB41(uVar6,0), this->fMap[uVar5].fPrefId != uVar4) {
        iVar8 = (int)uVar5;
        bVar3 = iVar8 < 1;
        uVar6 = (uint)bVar3;
        if (iVar8 < 1) goto LAB_002a567f;
        uVar5 = (ulong)(iVar8 - 1);
      }
      uVar4 = this->fMap[uVar5].fURIId;
    }
LAB_002a567f:
    if (bVar3 == false) {
      return uVar4;
    }
    if (*prefixToMap == L'\0') {
      return this->fEmptyNamespaceId;
    }
  }
  *unknown = true;
  return this->fUnknownNamespaceId;
}

Assistant:

unsigned int WFElemStack::mapPrefixToURI( const   XMLCh* const    prefixToMap
                                          ,       bool&           unknown) const
{
    // Assume we find it
    unknown = false;

    //
    //  Map the prefix to its unique id, from the prefix string pool. If its
    //  not a valid prefix, then its a failure.
    //
    unsigned int prefixId = fPrefixPool.getId(prefixToMap);
    if (!prefixId)
    {
        unknown = true;
        return fUnknownNamespaceId;
    }

    //
    //  Check for the special prefixes 'xml' and 'xmlns' since they cannot
    //  be overridden.
    //
    if (prefixId == fXMLPoolId)
        return fXMLNamespaceId;
    else if (prefixId == fXMLNSPoolId)
        return fXMLNSNamespaceId;

    //
    //  Start at the stack top and work backwards until we come to some
    //  element that mapped this prefix.
    //
    //  Get a convenience pointer to the stack top row
    StackElem* curRow = fStack[fStackTop - 1];
    for (int mapIndex = curRow->fTopPrefix; mapIndex >=0; mapIndex--)
    {
        if (fMap[mapIndex].fPrefId == prefixId)
            return fMap[mapIndex].fURIId;
    }

    //
    //  If the prefix is an empty string, then we will return the special
    //  global namespace id. This can be overridden, but no one has or we
    //  would have not gotten here.
    //
    if (!*prefixToMap)
        return fEmptyNamespaceId;

    // Oh well, don't have a clue so return the unknown id
    unknown = true;
    return fUnknownNamespaceId;
}